

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int hash_query(lua_State *L)

{
  StkId pTVar1;
  Table *t_00;
  int iVar2;
  Node *pNVar3;
  Table *t;
  TValue *o;
  lua_State *L_local;
  
  iVar2 = lua_type(L,2);
  if (iVar2 == -1) {
    iVar2 = lua_type(L,1);
    if (iVar2 != 4) {
      luaL_argerror(L,1,"string expected");
    }
    if ((L->ci->func[1].tt_ & 0xf) != 4) {
      __assert_fail("((((((((L->ci->func + (1))))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x328,"int hash_query(lua_State *)");
    }
    if (((L->ci->func[1].value_.gc)->tt & 0xf) != 4) {
      __assert_fail("((((((L->ci->func + (1)))->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x328,"int hash_query(lua_State *)");
    }
    lua_pushinteger(L,(ulong)*(uint *)(L->ci->func[1].value_.f + 0xc));
  }
  else {
    pTVar1 = L->ci->func;
    luaL_checktype(L,2,5);
    if (L->ci->func[2].tt_ != 0x8005) {
      __assert_fail("(((((L->ci->func + (2))))->tt_) == (((5) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x32e,"int hash_query(lua_State *)");
    }
    if ((L->ci->func[2].value_.gc)->tt != '\x05') {
      __assert_fail("((((L->ci->func + (2)))->value_).gc)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x32e,"int hash_query(lua_State *)");
    }
    t_00 = (Table *)L->ci->func[2].value_.gc;
    pNVar3 = luaH_mainposition(t_00,pTVar1 + 1);
    lua_pushinteger(L,(long)pNVar3 - (long)t_00->node >> 5);
  }
  return 1;
}

Assistant:

static int hash_query (lua_State *L) {
  if (lua_isnone(L, 2)) {
    luaL_argcheck(L, lua_type(L, 1) == LUA_TSTRING, 1, "string expected");
    lua_pushinteger(L, tsvalue(obj_at(L, 1))->hash);
  }
  else {
    TValue *o = obj_at(L, 1);
    Table *t;
    luaL_checktype(L, 2, LUA_TTABLE);
    t = hvalue(obj_at(L, 2));
    lua_pushinteger(L, luaH_mainposition(t, o) - t->node);
  }
  return 1;
}